

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O0

wstring * __thiscall
mjs::number_to_fixed_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int f)

{
  bool bVar1;
  bool bVar2;
  long local_1a8;
  wstringstream wss;
  wostream local_198 [380];
  int local_1c;
  double dStack_18;
  int f_local;
  double x_local;
  
  local_1c = (int)this;
  dStack_18 = x;
  x_local = (double)__return_storage_ptr__;
  bVar2 = std::isfinite(x);
  bVar1 = false;
  if (((bVar2) && (bVar1 = false, ABS(dStack_18) < 1e+21)) && (bVar1 = false, -1 < local_1c)) {
    bVar1 = local_1c < 0x15;
  }
  if (bVar1) {
    std::__cxx11::wstringstream::wstringstream((wstringstream *)&local_1a8);
    if (dStack_18 < 0.0) {
      dStack_18 = -dStack_18;
      std::operator<<(local_198,L'-');
    }
    std::ios_base::precision
              ((ios_base *)((long)&local_1a8 + *(long *)(local_1a8 + -0x18)),(long)local_1c);
    std::ios_base::flags((ios_base *)((long)&local_1a8 + *(long *)(local_1a8 + -0x18)),_S_fixed);
    std::wostream::operator<<(local_198,dStack_18);
    std::__cxx11::wstringstream::str();
    std::__cxx11::wstringstream::~wstringstream((wstringstream *)&local_1a8);
    return __return_storage_ptr__;
  }
  __assert_fail("std::isfinite(x) && std::fabs(x) < 1e21 && f >= 0 && f <= 20",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,0xa0,"std::wstring mjs::number_to_fixed(double, int)");
}

Assistant:

std::wstring number_to_fixed(double x, int f) {
    // TODO: Implement actual rules from ES3, 15.7.4.5
    assert(std::isfinite(x) && std::fabs(x) < 1e21 && f >= 0 && f <= 20);
    std::wstringstream wss;
    if (x < 0) {
        x = -x;
        wss << L'-';
    }
    wss.precision(f);
    wss.flags(std::ios::fixed);
    wss << x;
    return wss.str();
}